

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O1

int AF_A_FirePhoenixPL2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  undefined1 *puVar1;
  VM_UBYTE VVar2;
  AActor *actor;
  undefined8 *puVar3;
  player_t *player;
  AWeapon *this;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined8 uVar10;
  PClass *pPVar11;
  PClassActor *type;
  AActor *this_00;
  FState *state;
  char *__assertion;
  bool bVar12;
  double dVar13;
  double dVar14;
  DVector2 v;
  DVector3 pos;
  FSoundID local_60;
  FName local_5c;
  FName local_58 [2];
  double dStack_50;
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005a5500;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    actor = (AActor *)(param->field_0).field_1.a;
    if (actor != (AActor *)0x0) {
      if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
        (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar11 = (actor->super_DThinker).super_DObject.Class;
      bVar12 = pPVar11 != (PClass *)0x0;
      if (pPVar11 != pPVar4 && bVar12) {
        do {
          pPVar11 = pPVar11->ParentClass;
          bVar12 = pPVar11 != (PClass *)0x0;
          if (pPVar11 == pPVar4) break;
        } while (pPVar11 != (PClass *)0x0);
      }
      if (!bVar12) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005a5500;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005a54d5;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar10 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar10;
        }
        pPVar11 = (PClass *)puVar3[1];
        bVar12 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar4 && bVar12) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar12 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar4) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (!bVar12) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005a5500;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      player = actor->player;
      if (player == (player_t *)0x0) {
        return 0;
      }
      iVar5 = S_FindSound("weapons/phoenixpowshoot");
      this = player->ReadyWeapon;
      if (this != (AWeapon *)0x0) {
        puVar1 = &this->field_0x584;
        *(int *)puVar1 = *(int *)puVar1 + -1;
        if (*(int *)puVar1 != 0) {
          dVar13 = c_tan((actor->Angles).Pitch.Degrees * 0.017453292519943295);
          dVar14 = 5.0;
          if (dVar13 <= 5.0) {
            dVar14 = dVar13;
          }
          dVar13 = (double)(~-(ulong)(-5.0 < dVar13) & 0xc014000000000000 |
                           (ulong)dVar14 & -(ulong)(-5.0 < dVar13));
          uVar6 = FRandom::GenRand32(&pr_fp2);
          uVar7 = FRandom::GenRand32(&pr_fp2);
          uVar8 = FRandom::GenRand32(&pr_fp2);
          uVar9 = FRandom::GenRand32(&pr_fp2);
          dVar14 = actor->Floorclip;
          P_GetOffsetPosition((actor->__Pos).X,(actor->__Pos).Y,
                              (double)(int)((uVar6 & 0xff) - (uVar7 & 0xff)) * 0.0078125,
                              (double)(int)((uVar8 & 0xff) - (uVar9 & 0xff)) * 0.0078125);
          local_48.Z = ((26.0 - dVar13) - dVar14) + (actor->__Pos).Z;
          local_48.Y = dStack_50;
          local_58[0].Index = FName::NameManager::FindName(&FName::NameData,"PhoenixFX2",false);
          type = ClassForSpawn(local_58);
          this_00 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
          (this_00->target).field_0.p = actor;
          (this_00->Angles).Yaw.Degrees = (actor->Angles).Yaw.Degrees;
          AActor::VelFromAngle(this_00);
          dVar14 = (actor->Vel).Y;
          (this_00->Vel).X = (actor->Vel).X + (this_00->Vel).X;
          (this_00->Vel).Y = dVar14 + (this_00->Vel).Y;
          (this_00->Vel).Z = (0.1 - dVar13) * this_00->Speed;
          if ((player->refire == 0) || (bVar12 = S_IsActorPlayingSomething(actor,1,-1), !bVar12)) {
            local_60.ID = iVar5;
            S_Sound(actor,0x101,&local_60,1.0,1.0);
          }
          P_CheckMissileSpawn(this_00,actor->radius);
          return 0;
        }
      }
      local_5c.Index = FName::NameManager::FindName(&FName::NameData,"Powerdown",false);
      state = AActor::FindState((AActor *)this,&local_5c);
      P_SetPsprite(player,PSP_WEAPON,state,false);
      player->refire = 0;
      S_StopSound(actor,1);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005a54d5:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005a5500:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                ,0x50e,"int AF_A_FirePhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePhoenixPL2)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	double slope;
	FSoundID soundid;
	player_t *player;
	APhoenixRod *flamethrower;

	if (nullptr == (player = self->player))
	{
		return 0;
	}

	soundid = "weapons/phoenixpowshoot";

	flamethrower = static_cast<APhoenixRod *> (player->ReadyWeapon);
	if (flamethrower == nullptr || --flamethrower->FlameCount == 0)
	{ // Out of flame
		P_SetPsprite(player, PSP_WEAPON, flamethrower->FindState("Powerdown"));
		player->refire = 0;
		S_StopSound (self, CHAN_WEAPON);
		return 0;
	}

	slope = -self->Angles.Pitch.TanClamped();
	double xo = pr_fp2.Random2() / 128.;
	double yo = pr_fp2.Random2() / 128.;
	DVector3 pos = self->Vec3Offset(xo, yo, 26 + slope - self->Floorclip);

	slope += 0.1;
	mo = Spawn("PhoenixFX2", pos, ALLOW_REPLACE);
	mo->target = self;
	mo->Angles.Yaw = self->Angles.Yaw;
	mo->VelFromAngle();
	mo->Vel += self->Vel.XY();
	mo->Vel.Z = mo->Speed * slope;
	if (!player->refire || !S_IsActorPlayingSomething (self, CHAN_WEAPON, -1))
	{
		S_Sound (self, CHAN_WEAPON|CHAN_LOOP, soundid, 1, ATTN_NORM);
	}	
	P_CheckMissileSpawn (mo, self->radius);
	return 0;
}